

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::prepareForInsert
          (NumberStringBuilder *this,int32_t index,int32_t count,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  UErrorCode *status_local;
  int32_t count_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  if ((index == 0) && (-1 < this->fZero - count)) {
    this->fZero = this->fZero - count;
    this->fLength = count + this->fLength;
    this_local._4_4_ = this->fZero;
  }
  else {
    if ((index == this->fLength) &&
       (iVar1 = this->fZero, iVar2 = this->fLength, iVar3 = getCapacity(this),
       iVar1 + iVar2 + count < iVar3)) {
      this->fLength = count + this->fLength;
      return (this->fZero + this->fLength) - count;
    }
    this_local._4_4_ = prepareForInsertHelper(this,index,count,status);
  }
  return this_local._4_4_;
}

Assistant:

int32_t NumberStringBuilder::prepareForInsert(int32_t index, int32_t count, UErrorCode &status) {
    U_ASSERT(index >= 0);
    U_ASSERT(index <= fLength);
    U_ASSERT(count >= 0);
    if (index == 0 && fZero - count >= 0) {
        // Append to start
        fZero -= count;
        fLength += count;
        return fZero;
    } else if (index == fLength && fZero + fLength + count < getCapacity()) {
        // Append to end
        fLength += count;
        return fZero + fLength - count;
    } else {
        // Move chars around and/or allocate more space
        return prepareForInsertHelper(index, count, status);
    }
}